

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef sload(jit_State *J,int32_t slot)

{
  BCReg BVar1;
  long lVar2;
  TRef TVar3;
  uint uVar4;
  
  lVar2 = J->L->base[slot].it64;
  uVar4 = 0xe;
  if (0xfffffffffffffff1 < (ulong)(lVar2 >> 0x2f)) {
    uVar4 = ~(uint)(lVar2 >> 0x2f);
  }
  BVar1 = J->baseslot;
  (J->fold).ins.field_0.ot = (ushort)uVar4 | 0x4780;
  (J->fold).ins.field_0.op1 = (short)BVar1 + (short)slot;
  (J->fold).ins.field_0.op2 = 4;
  TVar3 = lj_ir_emit(J);
  if (uVar4 < 3) {
    TVar3 = uVar4 * 0x1000001 ^ 0x7fff;
  }
  J->base[slot] = TVar3;
  return TVar3;
}

Assistant:

static TRef sload(jit_State *J, int32_t slot)
{
  IRType t = itype2irt(&J->L->base[slot]);
  TRef ref = emitir_raw(IRTG(IR_SLOAD, t), (int32_t)J->baseslot+slot,
			IRSLOAD_TYPECHECK);
  if (irtype_ispri(t)) ref = TREF_PRI(t);  /* Canonicalize primitive refs. */
  J->base[slot] = ref;
  return ref;
}